

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

double __thiscall tinyxml2::XMLElement::DoubleAttribute(XMLElement *this,char *name)

{
  double local_20;
  double d;
  char *name_local;
  XMLElement *this_local;
  
  local_20 = 0.0;
  d = (double)name;
  name_local = (char *)this;
  QueryDoubleAttribute(this,name,&local_20);
  return local_20;
}

Assistant:

double 	 DoubleAttribute( const char* name ) const	{
        double d=0;
        QueryDoubleAttribute( name, &d );
        return d;
    }